

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_container_shrink_to_fit(run_container_t *src)

{
  void *pvVar1;
  int *in_RDI;
  rle16_t *oldruns;
  int savings;
  size_t in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_RDI == in_RDI[1]) {
    local_4 = 0;
  }
  else {
    local_4 = in_RDI[1] - *in_RDI;
    in_RDI[1] = *in_RDI;
    pvVar1 = roaring_realloc(*(void **)(in_RDI + 2),in_stack_ffffffffffffffd8);
    *(void **)(in_RDI + 2) = pvVar1;
    if (*(long *)(in_RDI + 2) == 0) {
      roaring_free((void *)0x12ecad);
    }
  }
  return local_4;
}

Assistant:

int run_container_shrink_to_fit(run_container_t *src) {
    if (src->n_runs == src->capacity) return 0;  // nothing to do
    int savings = src->capacity - src->n_runs;
    src->capacity = src->n_runs;
    rle16_t *oldruns = src->runs;
    src->runs =
        (rle16_t *)roaring_realloc(oldruns, src->capacity * sizeof(rle16_t));
    if (src->runs == NULL) roaring_free(oldruns);  // should never happen?
    return savings;
}